

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

path * __thiscall boost::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  type tVar1;
  bool bVar2;
  ulong uVar3;
  pointer ppVar4;
  long lVar5;
  string_type *psVar6;
  char *pcVar7;
  iterator *lhs;
  reference ppVar8;
  path *ppVar9;
  undefined1 local_168 [8];
  iterator next;
  string local_118 [8];
  string_type lf;
  undefined1 local_f0 [8];
  iterator itr;
  iterator stop;
  iterator last;
  undefined1 local_50 [8];
  iterator start;
  path *this_local;
  path *temp;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    start.m_pos._7_1_ = 0;
    path(__return_storage_ptr__);
    begin((iterator *)local_50,this);
    end((iterator *)&stop.m_pos,this);
    iterators::detail::
    iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
    ::operator--((iterator *)&itr.m_pos,
                 (iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_true,_false>
                  *)&stop.m_pos,0);
    iterator::iterator((iterator *)local_f0,(iterator *)local_50);
    while (tVar1 = iterators::operator!=
                             ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                               *)local_f0,
                              (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                               *)&itr.m_pos), tVar1) {
      ppVar4 = iterators::detail::
               iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                             *)local_f0);
      native_abi_cxx11_(ppVar4);
      lVar5 = std::__cxx11::string::size();
      if (lVar5 == 1) {
        ppVar4 = iterators::detail::
                 iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                 ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                               *)local_f0);
        psVar6 = native_abi_cxx11_(ppVar4);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
        if (((*pcVar7 != '.') ||
            (tVar1 = iterators::operator!=
                               ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                 *)local_f0,
                                (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                 *)local_50), !tVar1)) ||
           (tVar1 = iterators::operator!=
                              ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                *)local_f0,
                               (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                *)&stop.m_pos), !tVar1)) goto LAB_0011adf3;
      }
      else {
LAB_0011adf3:
        bVar2 = empty(__return_storage_ptr__);
        if (!bVar2) {
          ppVar4 = iterators::detail::
                   iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                   ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                 *)local_f0);
          native_abi_cxx11_(ppVar4);
          lVar5 = std::__cxx11::string::size();
          if (lVar5 == 2) {
            ppVar4 = iterators::detail::
                     iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                     ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                   *)local_f0);
            psVar6 = native_abi_cxx11_(ppVar4);
            pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
            if (*pcVar7 == '.') {
              ppVar4 = iterators::detail::
                       iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                       ::operator->((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                     *)local_f0);
              psVar6 = native_abi_cxx11_(ppVar4);
              pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar6);
              if (*pcVar7 == '.') {
                filename((path *)&next.m_pos,__return_storage_ptr__);
                psVar6 = native_abi_cxx11_((path *)&next.m_pos);
                std::__cxx11::string::string(local_118,(string *)psVar6);
                ~path((path *)&next.m_pos);
                lVar5 = std::__cxx11::string::size();
                if (((lVar5 == 0) ||
                    ((lVar5 = std::__cxx11::string::size(), lVar5 == 1 &&
                     ((pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_118),
                      *pcVar7 == '.' ||
                      (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_118),
                      *pcVar7 == '/')))))) ||
                   ((lVar5 = std::__cxx11::string::size(), lVar5 == 2 &&
                    ((pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_118),
                     *pcVar7 == '.' ||
                     (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_118),
                     *pcVar7 == '.')))))) {
                  lf.field_2._12_4_ = 0;
                }
                else {
                  remove_filename(__return_storage_ptr__);
                  iterator::iterator((iterator *)local_168,(iterator *)local_f0);
                  bVar2 = empty(__return_storage_ptr__);
                  if (bVar2) {
                    lhs = iterators::detail::
                          iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                          ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                        *)local_168);
                    tVar1 = iterators::operator!=
                                      ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                        *)lhs,(iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                               *)&itr.m_pos);
                    if ((tVar1) &&
                       (tVar1 = iterators::operator==
                                          ((iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                            *)local_168,
                                           (iterator_facade<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long>
                                            *)&stop.m_pos), tVar1)) {
                      ppVar8 = iterators::detail::
                               iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                               ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                                            *)&stop.m_pos);
                      ppVar9 = detail::dot_path();
                      bVar2 = operator==(ppVar8,ppVar9);
                      if (bVar2) {
                        ppVar9 = detail::dot_path();
                        operator/=(__return_storage_ptr__,ppVar9);
                      }
                    }
                  }
                  lf.field_2._12_4_ = 4;
                  iterator::~iterator((iterator *)local_168);
                }
                std::__cxx11::string::~string(local_118);
                if (lf.field_2._12_4_ != 0) goto LAB_0011b1a3;
              }
            }
          }
        }
        ppVar8 = iterators::detail::
                 iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                              *)local_f0);
        operator/=(__return_storage_ptr__,ppVar8);
      }
LAB_0011b1a3:
      iterators::detail::
      iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::filesystem::path::iterator,_const_boost::filesystem::path,_boost::iterators::bidirectional_traversal_tag,_const_boost::filesystem::path_&,_long,_false,_false>
                    *)local_f0);
    }
    lf.field_2._12_4_ = 2;
    iterator::~iterator((iterator *)local_f0);
    bVar2 = empty(__return_storage_ptr__);
    if (bVar2) {
      ppVar9 = detail::dot_path();
      operator/=(__return_storage_ptr__,ppVar9);
    }
    start.m_pos._7_1_ = 1;
    lf.field_2._12_4_ = 1;
    iterator::~iterator((iterator *)&itr.m_pos);
    iterator::~iterator((iterator *)&stop.m_pos);
    iterator::~iterator((iterator *)local_50);
    if ((start.m_pos._7_1_ & 1) == 0) {
      ~path(__return_storage_ptr__);
    }
  }
  else {
    path(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::lexically_normal() const
  {
    if (m_pathname.empty())
      return *this;
      
    path temp;
    iterator start(begin());
    iterator last(end());
    iterator stop(last--);
    for (iterator itr(start); itr != stop; ++itr)
    {
      // ignore "." except at start and last
      if (itr->native().size() == 1
        && (itr->native())[0] == dot
        && itr != start
        && itr != last) continue;

      // ignore a name and following ".."
      if (!temp.empty()
        && itr->native().size() == 2
        && (itr->native())[0] == dot
        && (itr->native())[1] == dot) // dot dot
      {
        string_type lf(temp.filename().native());  
        if (lf.size() > 0  
          && (lf.size() != 1
            || (lf[0] != dot
              && lf[0] != separator))
          && (lf.size() != 2 
            || (lf[0] != dot
              && lf[1] != dot
#             ifdef BOOST_WINDOWS_API
              && lf[1] != colon
#             endif
               )
             )
          )
        {
          temp.remove_filename();
          //// if not root directory, must also remove "/" if any
          //if (temp.native().size() > 0
          //  && temp.native()[temp.native().size()-1]
          //    == separator)
          //{
          //  string_type::size_type rds(
          //    root_directory_start(temp.native(), temp.native().size()));
          //  if (rds == string_type::npos
          //    || rds != temp.native().size()-1) 
          //  {
          //    temp.m_pathname.erase(temp.native().size()-1);
          //  }
          //}

          iterator next(itr);
          if (temp.empty() && ++next != stop
            && next == last && *last == detail::dot_path())
          {
            temp /= detail::dot_path();
          }
          continue;
        }
      }

      temp /= *itr;
    };

    if (temp.empty())
      temp /= detail::dot_path();
    return temp;
  }